

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loadable_extension_demo.cpp
# Opt level: O0

bool IntToBoundedCast(Vector *source,Vector *result,idx_t count,CastParameters *parameters)

{
  int32_t iVar1;
  LogicalType *input;
  anon_class_8_1_53fddac6 in_RCX;
  Vector *in_RSI;
  int32_t output_max_val;
  LogicalType *ty;
  LogicalType *in_stack_00000050;
  undefined4 in_stack_ffffffffffffffd0;
  
  input = duckdb::Vector::GetType(in_RSI);
  iVar1 = BoundedType::GetMaxValue(in_stack_00000050);
  duckdb::UnaryExecutor::
  Execute<int,int,IntToBoundedCast(duckdb::Vector&,duckdb::Vector&,unsigned_long,duckdb::CastParameters&)::__0>
            ((Vector *)input,(Vector *)CONCAT44(iVar1,in_stack_ffffffffffffffd0),
             (idx_t)&stack0xffffffffffffffd4,in_RCX,CANNOT_ERROR);
  return true;
}

Assistant:

static bool IntToBoundedCast(Vector &source, Vector &result, idx_t count, CastParameters &parameters) {
	auto &ty = result.GetType();
	auto output_max_val = BoundedType::GetMaxValue(ty);
	UnaryExecutor::Execute<int32_t, int32_t>(source, result, count, [&](int32_t input) {
		if (input > output_max_val) {
			throw ConversionException(StringUtil::Format("Value %s exceeds max value of bounded type (%s)",
			                                             to_string(input), to_string(output_max_val)));
		}
		return input;
	});
	return true;
}